

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
     WriteDeltaFor(uchar *values,bool *validity,bitpacking_width_t width,uchar frame_of_reference,
                  char delta_offset,uchar *original_values,idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  long lVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong __n;
  bitpacking_metadata_encoded_t encoded_value;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uchar *puVar12;
  ulong uVar13;
  uint8_t local_58 [40];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar3) + 0x20;
  }
  uVar13 = (ulong)width;
  uVar6 = iVar5 * uVar13 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,uVar6 + 3,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar4 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar4 + -4;
  *(uint *)(lVar4 + -4) = iVar1 - iVar2 | 0x4000000;
  **(uchar **)((long)data_ptr + 0x40) = frame_of_reference;
  lVar4 = *(long *)((long)data_ptr + 0x40);
  *(long *)((long)data_ptr + 0x40) = lVar4 + 1;
  *(bitpacking_width_t *)(lVar4 + 1) = width;
  lVar4 = *(long *)((long)data_ptr + 0x40);
  *(long *)((long)data_ptr + 0x40) = lVar4 + 1;
  *(char *)(lVar4 + 1) = delta_offset;
  lVar4 = *(long *)((long)data_ptr + 0x40) + 1;
  *(long *)((long)data_ptr + 0x40) = lVar4;
  __n = (ulong)((uint)count & 0x1f);
  uVar11 = count & 0xffffffffffffffe0;
  if (uVar11 != 0) {
    uVar8 = 0;
    uVar9 = 0;
    puVar12 = values;
    do {
      puVar7 = (uint8_t *)((uVar8 >> 3) + lVar4);
      lVar10 = 0;
      do {
        duckdb_fastpforlib::internal::fastpack_quarter(puVar12 + lVar10,puVar7,(uint)width);
        lVar10 = lVar10 + 8;
        puVar7 = puVar7 + uVar13;
      } while (lVar10 != 0x20);
      uVar9 = uVar9 + 0x20;
      uVar8 = uVar8 + (ulong)width * 0x20;
      puVar12 = puVar12 + 0x20;
    } while (uVar9 < uVar11);
  }
  if (__n != 0) {
    lVar10 = 0;
    switchD_012e5a64::default(local_58 + __n,0,0x20 - __n);
    switchD_012bc561::default(local_58,values + uVar11,__n);
    puVar7 = (uint8_t *)(lVar4 + (uVar11 * uVar13 >> 3));
    do {
      duckdb_fastpforlib::internal::fastpack_quarter(local_58 + lVar10,puVar7,(uint)width);
      lVar10 = lVar10 + 8;
      puVar7 = puVar7 + uVar13;
    } while (lVar10 != 0x20);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}